

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger string_slice(HSQUIRRELVM v)

{
  SQSharedState *pSVar1;
  SQInteger SVar2;
  SQObjectPtr *in_RDI;
  SQInteger slen;
  SQObjectPtr o;
  SQInteger eidx;
  SQInteger sidx;
  SQChar *in_stack_ffffffffffffff78;
  SQVM *in_stack_ffffffffffffff80;
  SQChar *in_stack_ffffffffffffff88;
  SQSharedState *in_stack_ffffffffffffff90;
  SQObjectPtr *this;
  SQInteger *in_stack_ffffffffffffffa0;
  SQInteger *in_stack_ffffffffffffffa8;
  SQObjectValue in_stack_ffffffffffffffb0;
  SQObjectPtr local_30;
  long local_20;
  long local_18;
  SQObjectPtr *local_10;
  SQRESULT local_8;
  
  this = &local_30;
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr(this);
  SVar2 = get_slice_params(in_stack_ffffffffffffffb0.nInteger,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0,this);
  if (SVar2 < 0) {
    local_8 = -1;
  }
  else {
    pSVar1 = ((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
             _sharedstate;
    if (local_18 < 0) {
      local_18 = (long)&pSVar1->_metamethods + local_18;
    }
    if (local_20 < 0) {
      local_20 = (long)&pSVar1->_metamethods + local_20;
    }
    if (local_20 < local_18) {
      local_8 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (((long)pSVar1 < local_20) || (local_18 < 0)) {
      local_8 = sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      in_stack_ffffffffffffff80 =
           (SQVM *)SQString::Create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                    (SQInteger)in_stack_ffffffffffffff80);
      SQObjectPtr::SQObjectPtr
                ((SQObjectPtr *)&stack0xffffffffffffffa8,(SQString *)in_stack_ffffffffffffff80);
      SQVM::Push(in_stack_ffffffffffffff80,local_10);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
      local_8 = 1;
    }
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  return local_8;
}

Assistant:

static SQInteger string_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(SQ_FAILED(get_slice_params(v,sidx,eidx,o)))return -1;
    SQInteger slen = _string(o)->_len;
    if(sidx < 0)sidx = slen + sidx;
    if(eidx < 0)eidx = slen + eidx;
    if(eidx < sidx) return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > slen || sidx < 0) return sq_throwerror(v, _SC("slice out of range"));
    v->Push(SQString::Create(_ss(v),&_stringval(o)[sidx],eidx-sidx));
    return 1;
}